

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O2

size_t bpkiEdataEnc(octet *epki,octet *edata,size_t edata_len,octet *salt,size_t iter)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  octet *poVar5;
  octet *poVar6;
  der_anchor_t PBKDF2_params [1];
  der_anchor_t PBKDF2AlgId [1];
  der_anchor_t PBES2_params [1];
  der_anchor_t EncryptionAlgId [1];
  der_anchor_t EPKI [1];
  der_anchor_t BeltKwpAlgId [1];
  der_anchor_t PrfAlgId [1];
  
  sVar1 = derTSEQEncStart(EPKI,epki,0,0x30);
  poVar6 = epki + sVar1;
  if (epki == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar2 = derTSEQEncStart(EncryptionAlgId,poVar6,sVar1,0x30);
  poVar5 = poVar6 + sVar2;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar3 = derOIDEnc(poVar5,"1.2.840.113549.1.5.13");
  poVar6 = poVar5 + sVar3;
  if (poVar5 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar3 = sVar3 + sVar2 + sVar1;
  sVar1 = derTSEQEncStart(PBES2_params,poVar6,sVar3,0x30);
  poVar5 = poVar6 + sVar1;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar1 = sVar1 + sVar3;
  sVar2 = derTSEQEncStart(PBKDF2AlgId,poVar5,sVar1,0x30);
  poVar6 = poVar5 + sVar2;
  if (poVar5 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar3 = derOIDEnc(poVar6,"1.2.840.113549.1.5.12");
  poVar5 = poVar6 + sVar3;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar3 = sVar3 + sVar2 + sVar1;
  sVar1 = derTSEQEncStart(PBKDF2_params,poVar5,sVar3,0x30);
  poVar6 = poVar5 + sVar1;
  if (poVar5 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar2 = derEnc(poVar6,4,salt,8);
  poVar5 = poVar6 + sVar2;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar4 = derTSIZEEnc(poVar5,2,iter);
  poVar6 = poVar5 + sVar4;
  if (poVar5 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar4 = sVar4 + sVar2 + sVar1 + sVar3;
  sVar1 = derTSEQEncStart(PrfAlgId,poVar6,sVar4,0x30);
  poVar5 = poVar6 + sVar1;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar2 = derOIDEnc(poVar5,"1.2.112.0.2.0.34.101.47.12");
  poVar6 = poVar5 + sVar2;
  if (poVar5 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar3 = derEnc(poVar6,5,(void *)0x0,0);
  poVar5 = poVar6 + sVar3;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar3 = sVar3 + sVar2 + sVar1 + sVar4;
  sVar1 = derTSEQEncStop(poVar5,sVar3,PrfAlgId);
  poVar6 = poVar5 + sVar1;
  if (poVar5 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar1 = sVar1 + sVar3;
  sVar2 = derTSEQEncStop(poVar6,sVar1,PBKDF2_params);
  poVar5 = poVar6 + sVar2;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar2 = sVar2 + sVar1;
  sVar1 = derTSEQEncStop(poVar5,sVar2,PBKDF2AlgId);
  poVar6 = poVar5 + sVar1;
  if (poVar5 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar1 = sVar1 + sVar2;
  sVar2 = derTSEQEncStart(BeltKwpAlgId,poVar6,sVar1,0x30);
  poVar5 = poVar6 + sVar2;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar3 = derOIDEnc(poVar5,"1.2.112.0.2.0.34.101.31.73");
  poVar6 = poVar5 + sVar3;
  if (poVar5 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar4 = derEnc(poVar6,5,(void *)0x0,0);
  poVar5 = poVar6 + sVar4;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar4 = sVar4 + sVar3 + sVar2 + sVar1;
  sVar1 = derTSEQEncStop(poVar5,sVar4,BeltKwpAlgId);
  poVar6 = poVar5 + sVar1;
  if (poVar5 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar1 = sVar1 + sVar4;
  sVar2 = derTSEQEncStop(poVar6,sVar1,PBES2_params);
  poVar5 = poVar6 + sVar2;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar2 = sVar2 + sVar1;
  sVar1 = derTSEQEncStop(poVar5,sVar2,EncryptionAlgId);
  poVar6 = poVar5 + sVar1;
  if (poVar5 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar3 = derEnc(poVar6,4,edata,edata_len);
  poVar5 = poVar6 + sVar3;
  if (poVar6 == (octet *)0x0) {
    poVar5 = (octet *)0x0;
  }
  sVar3 = sVar3 + sVar1 + sVar2;
  sVar1 = derTSEQEncStop(poVar5,sVar3,EPKI);
  return sVar1 + sVar3;
}

Assistant:

static size_t bpkiEdataEnc(octet epki[], const octet edata[], size_t edata_len,
	const octet salt[8], size_t iter)
{
	der_anchor_t EPKI[1];
	der_anchor_t EncryptionAlgId[1];
	der_anchor_t PBES2_params[1];
	der_anchor_t PBKDF2AlgId[1];
	der_anchor_t PBKDF2_params[1];
	der_anchor_t PrfAlgId[1];
	der_anchor_t BeltKwpAlgId[1];
	size_t count = 0;
	// кодировать
	derEncStep(derSEQEncStart(EPKI, epki, count), epki, count);
	 derEncStep(derSEQEncStart(EncryptionAlgId, epki, count), epki, count);
	  derEncStep(derOIDEnc(epki, oid_id_pbes2), epki, count);
	  derEncStep(derSEQEncStart(PBES2_params, epki, count), epki, count);
	   derEncStep(derSEQEncStart(PBKDF2AlgId, epki, count), epki, count);
	    derEncStep(derOIDEnc(epki, oid_id_pbkdf2), epki, count);
	    derEncStep(derSEQEncStart(PBKDF2_params, epki, count), epki, count);
	     derEncStep(derOCTEnc(epki, salt, 8), epki, count);
		 derEncStep(derSIZEEnc(epki, iter), epki, count);
		 derEncStep(derSEQEncStart(PrfAlgId, epki, count), epki, count);
		  derEncStep(derOIDEnc(epki, oid_hmac_hbelt), epki, count);
		  derEncStep(derNULLEnc(epki), epki, count);
		 derEncStep(derSEQEncStop(epki, count, PrfAlgId), epki, count);
		derEncStep(derSEQEncStop(epki, count, PBKDF2_params), epki, count);
	   derEncStep(derSEQEncStop(epki, count, PBKDF2AlgId), epki, count);
	   derEncStep(derSEQEncStart(BeltKwpAlgId, epki, count), epki, count);
	    derEncStep(derOIDEnc(epki, oid_belt_kwp256), epki, count);
	    derEncStep(derNULLEnc(epki), epki, count);
	  derEncStep(derSEQEncStop(epki, count, BeltKwpAlgId), epki, count);
	  derEncStep(derSEQEncStop(epki, count, PBES2_params), epki, count);
	  derEncStep(derSEQEncStop(epki, count, EncryptionAlgId), epki, count);
	 derEncStep(derOCTEnc(epki, edata, edata_len), epki, count);
	derEncStep(derSEQEncStop(epki, count, EPKI), epki, count);
	// возвратить длину DER-кода
	return count;
}